

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_bitstream_mx(TrackData *trackdata)

{
  DataRate datarate_;
  bool bVar1;
  bool bVar2;
  uint sector_;
  bool bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  ushort uVar9;
  int iVar10;
  int size_;
  BitBuffer *this;
  LogHelper *pLVar11;
  bool local_189;
  string local_118;
  string local_f8;
  undefined2 local_d6;
  int local_d4;
  undefined1 local_d0 [2];
  uint8_t lsb;
  uint8_t msb;
  int i;
  undefined1 local_c0 [8];
  Sector sector;
  int s;
  bool sync;
  BitBuffer *bitbuf;
  ushort local_54;
  bool zero_cksum;
  uint16_t extra;
  uint16_t stored_track;
  uint16_t cksum;
  uint16_t stored_cksum;
  uint64_t dword;
  Data block;
  Track track;
  TrackData *trackdata_local;
  
  Track::Track((Track *)&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
  Data::Data((Data *)&dword);
  _extra = 0;
  bVar2 = false;
  this = TrackData::bitstream(trackdata);
  BitBuffer::seek(this,0);
  this->encoding = FM;
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = BitBuffer::track_bitsize(this);
  bVar1 = false;
  while ((bVar3 = BitBuffer::wrapped(this), ((bVar3 ^ 0xffU) & 1) != 0 &&
         (((iVar10 = Track::size((Track *)&block.
                                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                           .
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
           iVar10 != 0 ||
           (iVar10 = BitBuffer::tell(this),
           iVar10 <= (int)block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage)) && (!bVar1))))) {
    bVar4 = BitBuffer::read1(this);
    _extra = _extra * 2 | (ulong)bVar4;
    if (_extra == 0x88888888aaaa88aa) {
      bVar1 = true;
      if (opt.debug != 0) {
        pLVar11 = util::operator<<((LogHelper *)&util::cout,(char (*) [24])"  s_b_mx found sync at "
                                  );
        sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = BitBuffer::tell(this);
        pLVar11 = util::operator<<(pLVar11,(int *)((long)&sector.m_data.
                                                                                                                    
                                                  super__Vector_base<Data,_std::allocator<Data>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
        util::operator<<(pLVar11,(char (*) [2])0x2a74b6);
      }
      uVar5 = BitBuffer::read_byte(this);
      uVar6 = BitBuffer::read_byte(this);
      for (sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          sector_ = (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
          (int)(uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage < 0xb;
          sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 1) {
        datarate_ = this->datarate;
        iVar10 = (trackdata->cylhead).head;
        size_ = SizeToCode(0x100);
        Header::Header((Header *)local_d0,(uint)CONCAT11(uVar5,uVar6),iVar10,sector_,size_);
        Sector::Sector((Sector *)local_c0,datarate_,MX,(Header *)local_d0,0);
        iVar10 = BitBuffer::tell(this);
        sector.datarate = BitBuffer::track_offset(this,iVar10);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dword);
        local_54 = 0;
        for (local_d4 = 0; local_d4 < 0x80; local_d4 = local_d4 + 1) {
          uVar7 = BitBuffer::read_byte(this);
          local_d6._1_1_ = uVar7;
          uVar7 = BitBuffer::read_byte(this);
          local_d6 = CONCAT11(local_d6._1_1_,uVar7);
          local_54 = local_54 + local_d6;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dword,
                     (value_type *)&local_d6);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dword,
                     (value_type *)((long)&local_d6 + 1));
        }
        uVar7 = BitBuffer::read_byte(this);
        uVar8 = BitBuffer::read_byte(this);
        uVar9 = CONCAT11(uVar7,uVar8);
        if (opt.debug != 0) {
          util::fmt_abi_cxx11_
                    (&local_f8,"cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",
                     (ulong)(uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar9,
                     (ulong)local_54,(ulong)uVar9,(uint)local_54);
          util::operator<<((LogHelper *)&util::cout,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        if (local_54 == uVar9) {
          local_189 = bVar2 && uVar9 == 0;
          Sector::add((Sector *)local_c0,(Data *)&dword,local_189,'\0');
        }
        else {
          Sector::add((Sector *)local_c0,(Data *)&dword,true,'\0');
          if (uVar9 == 0) {
            bVar2 = true;
          }
        }
        Track::add((Track *)&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(Sector *)local_c0);
        Sector::~Sector((Sector *)local_c0);
      }
      uVar7 = BitBuffer::read_byte(this);
      uVar8 = BitBuffer::read_byte(this);
      if (opt.debug != 0) {
        util::fmt_abi_cxx11_
                  (&local_118,"  s_b_mx c:h %d:%d stored %d extra %06o\n",
                   (ulong)(uint)(trackdata->cylhead).cyl,(ulong)(uint)(trackdata->cylhead).head,
                   (ulong)CONCAT11(uVar5,uVar6),(ulong)CONCAT11(uVar7,uVar8));
        util::operator<<((LogHelper *)&util::cout,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
    }
  }
  TrackData::add(trackdata,
                 (Track *)&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  Data::~Data((Data *)&dword);
  Track::~Track((Track *)&block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void scan_bitstream_mx(TrackData& trackdata)
{
    Track track;
    Data block;
    uint64_t dword = 0;
    uint16_t stored_cksum = 0, cksum = 0, stored_track = 0, extra = 0;
    bool zero_cksum = false;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    bitbuf.encoding = Encoding::FM;
    track.tracklen = bitbuf.track_bitsize();
    bool sync = false;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        // ignore sync sequences after first one
        if (sync)
            break;

        dword = (dword << 1) | bitbuf.read1();

        switch (dword)
        {
        case 0x88888888aaaa88aa:    // FM-encoded 0x00f3 (000363 octal)
            sync = true;
            if (opt.debug)
                util::cout << "  s_b_mx found sync at " << bitbuf.tell() << "\n";
            break;

        default:
            continue;
        }

        // skip track number
        stored_track = bitbuf.read_byte() << 8;
        stored_track |= bitbuf.read_byte();

        // read sectors
        for (auto s = 0; s < 11; s++) {
            Sector sector(bitbuf.datarate, Encoding::MX, Header(stored_track, trackdata.cylhead.head, s, SizeToCode(256)));
            sector.offset = bitbuf.track_offset(bitbuf.tell());

            block.clear();
            cksum = 0;

            for (auto i = 0; i < 128; i++) {
                auto msb = bitbuf.read_byte();
                auto lsb = bitbuf.read_byte();
                cksum += (lsb | (msb << 8));
                block.push_back(lsb);
                block.push_back(msb);
            }

            stored_cksum = bitbuf.read_byte() << 8;
            stored_cksum |= bitbuf.read_byte();

            if (opt.debug)
                util::cout << util::fmt("cksum s %2d disk:calc %06o:%06o (%04x:%04x)\n",
                    s, stored_cksum, cksum, stored_cksum, cksum);

            /*
             * Flux stream on some marginal disks may decode as stream of zero bits instead of valid
             * data, but checksum of all zeros is also zero...
             */
            if (cksum != stored_cksum)
            {
                sector.add(std::move(block), true, 0);
                if (stored_cksum == 0)
                {
                    zero_cksum = true;
                }
            }
            else
            {
                sector.add(std::move(block), (zero_cksum && stored_cksum == 0), 0);
            }
            track.add(std::move(sector));
        }

        extra = bitbuf.read_byte() << 8;
        extra |= bitbuf.read_byte();

        if (opt.debug)
            util::cout << util::fmt("  s_b_mx c:h %d:%d stored %d extra %06o\n",
                trackdata.cylhead.cyl, trackdata.cylhead.head, stored_track, extra);
    }

    trackdata.add(std::move(track));
}